

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_blas2.c
# Opt level: O1

int sp_dtrsv(char *uplo,char *trans,char *diag,SuperMatrix *L,SuperMatrix *U,double *x,
            SuperLUStat_t *stat,int *info)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  long lVar8;
  ulong uVar9;
  double *M;
  uint uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  doublereal *a;
  long lVar14;
  double *pdVar15;
  void *pvVar16;
  long lVar17;
  void *pvVar18;
  long lVar19;
  int iVar20;
  int *piVar21;
  double dVar22;
  float fVar23;
  int nsupc;
  undefined8 local_170;
  double *local_168;
  void *local_160;
  SuperMatrix *local_158;
  int incx;
  long local_148;
  long local_140;
  int nsupr;
  
  incx = 1;
  *info = 0;
  if ((*uplo == 'U') || (iVar20 = -1, *uplo == 'L')) {
    iVar20 = -2;
    if (((0x11 < (byte)*trans - 0x43) || ((0x20801U >> ((byte)*trans - 0x43 & 0x1f) & 1) == 0)) ||
       ((*diag != 'U' && (iVar20 = -3, *diag != 'N')))) goto LAB_001038d3;
    iVar20 = -4;
    if ((L->nrow < 0) || (L->nrow != L->ncol)) goto LAB_001038d3;
    iVar20 = -5;
    if ((U->nrow < 0) || (U->nrow != U->ncol)) goto LAB_001038d3;
  }
  else {
LAB_001038d3:
    *info = iVar20;
  }
  if (*info != 0) {
    nsupr = -*info;
    input_error("sp_dtrsv",&nsupr);
    return 0;
  }
  local_160 = L->Store;
  lVar5 = *(long *)((long)local_160 + 8);
  pvVar16 = U->Store;
  lVar19 = *(long *)((long)pvVar16 + 8);
  local_170 = uplo;
  local_158 = U;
  local_168 = doubleCalloc((long)L->nrow);
  if (local_168 == (double *)0x0) {
    sprintf((char *)&nsupr,"%s at line %d in file %s\n","Malloc fails for work in sp_dtrsv().",0x7f,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/dsp_blas2.c");
    superlu_abort_and_exit((char *)&nsupr);
  }
  pdVar15 = local_168;
  if (*trans == 'N') {
    if (*local_170 == 'L') {
      if (L->nrow == 0) {
        return 0;
      }
      if (-1 < *(int *)((long)local_160 + 4)) {
        local_148 = lVar5 + 8;
        fVar23 = 0.0;
        pvVar16 = local_160;
        lVar19 = 0;
        do {
          lVar17 = *(long *)((long)pvVar16 + 0x20);
          iVar20 = *(int *)(*(long *)((long)pvVar16 + 0x30) + lVar19 * 4);
          lVar8 = (long)iVar20;
          uVar1 = *(uint *)(lVar17 + lVar8 * 4);
          nsupr = *(int *)(lVar17 + 4 + lVar8 * 4) - uVar1;
          iVar20 = *(int *)(*(long *)((long)pvVar16 + 0x30) + 4 + lVar19 * 4) - iVar20;
          lVar13 = (long)*(int *)(*(long *)((long)pvVar16 + 0x10) + lVar8 * 4);
          uVar10 = nsupr - iVar20;
          nsupc = iVar20;
          if (iVar20 == 1) {
            iVar2 = *(int *)(lVar17 + 4 + lVar8 * 4);
            if ((int)((long)(int)uVar1 + 1) < iVar2) {
              lVar17 = *(long *)((long)pvVar16 + 0x18);
              lVar12 = 0;
              do {
                iVar3 = *(int *)(((long)(int)uVar1 + 1) * 4 + lVar17 + lVar12 * 4);
                x[iVar3] = x[iVar3] - x[lVar8] * *(double *)(local_148 + lVar13 * 8 + lVar12 * 8);
                lVar12 = lVar12 + 1;
              } while (~uVar1 + iVar2 != (int)lVar12);
            }
          }
          else {
            local_158 = (SuperMatrix *)(x + lVar8);
            local_170 = (char *)CONCAT44(local_170._4_4_,fVar23);
            local_140 = lVar13;
            dlsolve(nsupr,iVar20,(double *)(lVar13 * 8 + lVar5),(double *)local_158);
            dmatvec(nsupr,nsupr - nsupc,nsupc,(double *)(lVar5 + (long)((int)local_140 + nsupc) * 8)
                    ,(double *)local_158,local_168);
            pdVar15 = local_168;
            pvVar16 = local_160;
            fVar23 = (float)local_170;
            if (0 < (int)uVar10) {
              lVar17 = *(long *)((long)local_160 + 0x18);
              uVar9 = 0;
              do {
                iVar2 = *(int *)((long)(int)(uVar1 + nsupc) * 4 + lVar17 + uVar9 * 4);
                x[iVar2] = x[iVar2] - local_168[uVar9];
                local_168[uVar9] = 0.0;
                uVar9 = uVar9 + 1;
              } while (uVar9 < uVar10);
            }
          }
          fVar23 = fVar23 + (float)((iVar20 + -1) * iVar20) + (float)(int)(uVar10 * iVar20 * 2);
          bVar7 = lVar19 < *(int *)((long)pvVar16 + 4);
          lVar19 = lVar19 + 1;
        } while (bVar7);
        goto LAB_00103f0f;
      }
    }
    else {
      if (local_158->nrow == 0) {
        return 0;
      }
      if (-1 < (long)*(int *)((long)local_160 + 4)) {
        fVar23 = 0.0;
        pvVar18 = local_160;
        lVar17 = (long)*(int *)((long)local_160 + 4);
        do {
          iVar20 = *(int *)(*(long *)((long)pvVar18 + 0x30) + lVar17 * 4);
          lVar8 = (long)iVar20;
          nsupr = *(int *)(*(long *)((long)pvVar18 + 0x20) + 4 + lVar8 * 4) -
                  *(int *)(*(long *)((long)pvVar18 + 0x20) + lVar8 * 4);
          nsupc = *(int *)(*(long *)((long)pvVar18 + 0x30) + 4 + lVar17 * 4) - iVar20;
          fVar23 = (float)((nsupc + 1) * nsupc) + fVar23;
          M = (double *)((long)*(int *)(*(long *)((long)pvVar18 + 0x10) + lVar8 * 4) * 8 + lVar5);
          if (nsupc == 1) {
            x[lVar8] = x[lVar8] / *M;
            iVar20 = *(int *)(*(long *)((long)pvVar16 + 0x18) + lVar8 * 4);
            lVar13 = (long)iVar20;
            iVar2 = *(int *)(*(long *)((long)pvVar16 + 0x18) + 4 + lVar8 * 4);
            if (iVar20 < iVar2) {
              lVar12 = *(long *)((long)pvVar16 + 0x10);
              do {
                iVar20 = *(int *)(lVar12 + lVar13 * 4);
                x[iVar20] = x[iVar20] - x[lVar8] * *(double *)(lVar19 + lVar13 * 8);
                lVar13 = lVar13 + 1;
              } while (iVar2 != lVar13);
            }
          }
          else {
            local_170 = (char *)CONCAT44(local_170._4_4_,fVar23);
            dusolve(nsupr,nsupc,M,x + lVar8);
            iVar2 = *(int *)(*(long *)((long)local_160 + 0x30) + 4 + lVar17 * 4);
            pdVar15 = local_168;
            pvVar18 = local_160;
            fVar23 = (float)local_170;
            if (iVar20 < iVar2) {
              lVar13 = *(long *)((long)pvVar16 + 0x18);
              do {
                iVar20 = *(int *)(lVar13 + 4 + lVar8 * 4);
                iVar3 = *(int *)(lVar13 + lVar8 * 4);
                lVar12 = (long)iVar3;
                if (iVar20 - iVar3 != 0 && iVar3 <= iVar20) {
                  lVar14 = *(long *)((long)pvVar16 + 0x10);
                  do {
                    iVar11 = *(int *)(lVar14 + lVar12 * 4);
                    x[iVar11] = x[iVar11] - x[lVar8] * *(double *)(lVar19 + lVar12 * 8);
                    lVar12 = lVar12 + 1;
                  } while (iVar20 != lVar12);
                }
                lVar8 = lVar8 + 1;
                fVar23 = fVar23 + (float)((iVar20 - iVar3) * 2);
              } while (lVar8 != iVar2);
            }
          }
          bVar7 = 0 < lVar17;
          lVar17 = lVar17 + -1;
        } while (bVar7);
        goto LAB_00103f0f;
      }
    }
  }
  else if (*local_170 == 'L') {
    if (L->nrow == 0) {
      return 0;
    }
    if (-1 < (long)*(int *)((long)local_160 + 4)) {
      fVar23 = 0.0;
      lVar19 = (long)*(int *)((long)local_160 + 4);
      do {
        lVar17 = *(long *)((long)local_160 + 0x30);
        iVar20 = *(int *)(lVar17 + lVar19 * 4);
        lVar13 = (long)iVar20;
        iVar2 = *(int *)(*(long *)((long)local_160 + 0x20) + lVar13 * 4);
        nsupr = *(int *)(*(long *)((long)local_160 + 0x20) + 4 + lVar13 * 4) - iVar2;
        nsupc = *(int *)(lVar17 + 4 + lVar19 * 4) - iVar20;
        lVar8 = *(long *)((long)local_160 + 0x10);
        local_158 = (SuperMatrix *)(long)*(int *)(lVar8 + lVar13 * 4);
        iVar3 = *(int *)(lVar17 + 4 + lVar19 * 4);
        if (iVar20 < iVar3) {
          lVar17 = lVar13;
          do {
            lVar12 = (long)*(int *)(lVar8 + lVar17 * 4) + (long)nsupc;
            iVar20 = *(int *)(lVar8 + 4 + lVar17 * 4);
            if ((int)lVar12 < iVar20) {
              dVar22 = x[lVar17];
              piVar21 = (int *)(*(long *)((long)local_160 + 0x18) + (long)(iVar2 + nsupc) * 4);
              do {
                dVar22 = dVar22 - x[*piVar21] * *(double *)(lVar5 + lVar12 * 8);
                x[lVar17] = dVar22;
                lVar12 = lVar12 + 1;
                piVar21 = piVar21 + 1;
              } while (lVar12 < iVar20);
            }
            lVar17 = lVar17 + 1;
          } while (lVar17 != iVar3);
        }
        fVar23 = fVar23 + (float)((nsupr - nsupc) * nsupc * 2);
        if (1 < nsupc) {
          local_170 = (char *)CONCAT44(local_170._4_4_,fVar23 + (float)((nsupc + -1) * nsupc));
          dtrsv_("L","T","U",&nsupc,(doublereal *)(lVar5 + (long)local_158 * 8),&nsupr,x + lVar13,
                 &incx);
          fVar23 = (float)local_170;
        }
        bVar7 = 0 < lVar19;
        pdVar15 = local_168;
        lVar19 = lVar19 + -1;
      } while (bVar7);
      goto LAB_00103f0f;
    }
  }
  else {
    if (local_158->nrow == 0) {
      return 0;
    }
    if (-1 < *(int *)((long)local_160 + 4)) {
      fVar23 = 0.0;
      lVar17 = 0;
      do {
        lVar8 = *(long *)((long)local_160 + 0x30);
        iVar20 = *(int *)(lVar8 + lVar17 * 4);
        lVar13 = (long)iVar20;
        nsupr = *(int *)(*(long *)((long)local_160 + 0x20) + 4 + lVar13 * 4) -
                *(int *)(*(long *)((long)local_160 + 0x20) + lVar13 * 4);
        iVar11 = *(int *)(lVar8 + 4 + lVar17 * 4) - iVar20;
        iVar2 = *(int *)(*(long *)((long)local_160 + 0x10) + lVar13 * 4);
        local_170 = (char *)(long)iVar2;
        iVar3 = *(int *)(lVar8 + 4 + lVar17 * 4);
        if (iVar20 < iVar3) {
          lVar8 = *(long *)((long)pvVar16 + 0x18);
          lVar12 = lVar13;
          do {
            iVar20 = *(int *)(lVar8 + 4 + lVar12 * 4);
            iVar4 = *(int *)(lVar8 + lVar12 * 4);
            lVar14 = (long)iVar4;
            if (iVar20 - iVar4 != 0 && iVar4 <= iVar20) {
              lVar6 = *(long *)((long)pvVar16 + 0x10);
              dVar22 = x[lVar12];
              do {
                dVar22 = dVar22 - x[*(int *)(lVar6 + lVar14 * 4)] * *(double *)(lVar19 + lVar14 * 8)
                ;
                x[lVar12] = dVar22;
                lVar14 = lVar14 + 1;
              } while (iVar20 != lVar14);
            }
            lVar12 = lVar12 + 1;
            fVar23 = fVar23 + (float)((iVar20 - iVar4) * 2);
          } while (lVar12 != iVar3);
        }
        a = (doublereal *)((long)local_170 * 8 + lVar5);
        nsupc = iVar11;
        if (iVar11 == 1) {
          x[lVar13] = x[lVar13] / *a;
        }
        else {
          local_170._4_4_ = iVar2 >> 0x1f;
          local_170 = (char *)CONCAT44(local_170._4_4_,fVar23);
          dtrsv_("U","T","N",&nsupc,a,&nsupr,x + lVar13,&incx);
          fVar23 = (float)local_170;
        }
        fVar23 = fVar23 + (float)((iVar11 + 1) * iVar11);
        bVar7 = lVar17 < *(int *)((long)local_160 + 4);
        pdVar15 = local_168;
        lVar17 = lVar17 + 1;
      } while (bVar7);
      goto LAB_00103f0f;
    }
  }
  fVar23 = 0.0;
LAB_00103f0f:
  stat->ops[0x11] = fVar23 + stat->ops[0x11];
  superlu_free(pdVar15);
  return 0;
}

Assistant:

int
sp_dtrsv(char *uplo, char *trans, char *diag, SuperMatrix *L, 
         SuperMatrix *U, double *x, SuperLUStat_t *stat, int *info)
{
#ifdef _CRAY
    _fcd ftcs1 = _cptofcd("L", strlen("L")),
	 ftcs2 = _cptofcd("N", strlen("N")),
	 ftcs3 = _cptofcd("U", strlen("U"));
#endif
    SCformat *Lstore;
    NCformat *Ustore;
    double   *Lval, *Uval;
    int incx = 1, incy = 1;
    double alpha = 1.0, beta = 1.0;
    int nrow, irow, jcol;
    int fsupc, nsupr, nsupc;
    int_t luptr, istart, i, k, iptr;
    double *work;
    flops_t solve_ops;

    /* Test the input parameters */
    *info = 0;
    if ( strncmp(uplo,"L", 1)!=0 && strncmp(uplo, "U", 1)!=0 ) *info = -1;
    else if ( strncmp(trans, "N", 1)!=0 && strncmp(trans, "T", 1)!=0 && 
              strncmp(trans, "C", 1)!=0) *info = -2;
    else if ( strncmp(diag, "U", 1)!=0 && strncmp(diag, "N", 1)!=0 )
         *info = -3;
    else if ( L->nrow != L->ncol || L->nrow < 0 ) *info = -4;
    else if ( U->nrow != U->ncol || U->nrow < 0 ) *info = -5;
    if ( *info ) {
	int ii = -(*info);
	input_error("sp_dtrsv", &ii);
	return 0;
    }

    Lstore = L->Store;
    Lval = Lstore->nzval;
    Ustore = U->Store;
    Uval = Ustore->nzval;
    solve_ops = 0;

    if ( !(work = doubleCalloc(L->nrow)) )
	ABORT("Malloc fails for work in sp_dtrsv().");
    
    if ( strncmp(trans, "N", 1)==0 ) {	/* Form x := inv(A)*x. */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L)*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
		fsupc = L_FST_SUPC(k);
		istart = L_SUB_START(fsupc);
		nsupr = L_SUB_START(fsupc+1) - istart;
		nsupc = L_FST_SUPC(k+1) - fsupc;
		luptr = L_NZ_START(fsupc);
		nrow = nsupr - nsupc;

	        solve_ops += nsupc * (nsupc - 1);
	        solve_ops += 2 * nrow * nsupc;

		if ( nsupc == 1 ) {
		    for (iptr=istart+1; iptr < L_SUB_START(fsupc+1); ++iptr) {
			irow = L_SUB(iptr);
			++luptr;
			x[irow] -= x[fsupc] * Lval[luptr];
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    STRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    SGEMV(ftcs2, &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#else
		    dtrsv_("L", "N", "U", &nsupc, &Lval[luptr], &nsupr,
		       	&x[fsupc], &incx);
		
		    dgemv_("N", &nrow, &nsupc, &alpha, &Lval[luptr+nsupc], 
		       	&nsupr, &x[fsupc], &incx, &beta, &work[0], &incy);
#endif
#else
		    dlsolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc]);
		
		    dmatvec ( nsupr, nsupr-nsupc, nsupc, &Lval[luptr+nsupc],
                             &x[fsupc], &work[0] );
#endif		
		
		    iptr = istart + nsupc;
		    for (i = 0; i < nrow; ++i, ++iptr) {
			irow = L_SUB(iptr);
			x[irow] -= work[i];	/* Scatter */
			work[i] = 0.0;

		    }
	 	}
	    } /* for k ... */
	    
	} else {
	    /* Form x := inv(U)*x */
	    
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; k--) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);
		
    	        solve_ops += nsupc * (nsupc + 1);

		if ( nsupc == 1 ) {
		    x[fsupc] /= Lval[luptr];
		    for (i = U_NZ_START(fsupc); i < U_NZ_START(fsupc+1); ++i) {
			irow = U_SUB(i);
			x[irow] -= x[fsupc] * Uval[i];
		    }
		} else {
#ifdef USE_VENDOR_BLAS
#ifdef _CRAY
		    STRSV(ftcs3, ftcs2, ftcs2, &nsupc, &Lval[luptr], &nsupr,
		       &x[fsupc], &incx);
#else
		    dtrsv_("U", "N", "N", &nsupc, &Lval[luptr], &nsupr,
                           &x[fsupc], &incx);
#endif
#else		
		    dusolve ( nsupr, nsupc, &Lval[luptr], &x[fsupc] );
#endif		

		    for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		        solve_ops += 2*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    	for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); 
				i++) {
			    irow = U_SUB(i);
			    x[irow] -= x[jcol] * Uval[i];
		    	}
                    }
		}
	    } /* for k ... */
	    
	}
    } else { /* Form x := inv(A')*x */
	
	if ( strncmp(uplo, "L", 1)==0 ) {
	    /* Form x := inv(L')*x */
    	    if ( L->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = Lstore->nsuper; k >= 0; --k) {
	    	fsupc = L_FST_SUPC(k);
	    	istart = L_SUB_START(fsupc);
	    	nsupr = L_SUB_START(fsupc+1) - istart;
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		solve_ops += 2 * (nsupr - nsupc) * nsupc;

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    iptr = istart + nsupc;
		    for (i = L_NZ_START(jcol) + nsupc; 
				i < L_NZ_START(jcol+1); i++) {
			irow = L_SUB(iptr);
			x[jcol] -= x[irow] * Lval[i];
			iptr++;
		    }
		}
		
		if ( nsupc > 1 ) {
		    solve_ops += nsupc * (nsupc - 1);
#ifdef _CRAY
                    ftcs1 = _cptofcd("L", strlen("L"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("U", strlen("U"));
		    STRSV(ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#else
		    dtrsv_("L", "T", "U", &nsupc, &Lval[luptr], &nsupr,
			&x[fsupc], &incx);
#endif
		}
	    }
	} else {
	    /* Form x := inv(U')*x */
	    if ( U->nrow == 0 ) return 0; /* Quick return */
	    
	    for (k = 0; k <= Lstore->nsuper; k++) {
	    	fsupc = L_FST_SUPC(k);
	    	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	    	nsupc = L_FST_SUPC(k+1) - fsupc;
	    	luptr = L_NZ_START(fsupc);

		for (jcol = fsupc; jcol < L_FST_SUPC(k+1); jcol++) {
		    solve_ops += 2*(U_NZ_START(jcol+1) - U_NZ_START(jcol));
		    for (i = U_NZ_START(jcol); i < U_NZ_START(jcol+1); i++) {
			irow = U_SUB(i);
			x[jcol] -= x[irow] * Uval[i];
		    }
		}

		solve_ops += nsupc * (nsupc + 1);

		if ( nsupc == 1 ) {
		    x[fsupc] /= Lval[luptr];
		} else {
#ifdef _CRAY
                    ftcs1 = _cptofcd("U", strlen("U"));
                    ftcs2 = _cptofcd("T", strlen("T"));
                    ftcs3 = _cptofcd("N", strlen("N"));
		    STRSV( ftcs1, ftcs2, ftcs3, &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#else
		    dtrsv_("U", "T", "N", &nsupc, &Lval[luptr], &nsupr,
			    &x[fsupc], &incx);
#endif
		}
	    } /* for k ... */
	}
    }

    stat->ops[SOLVE] += solve_ops;
    SUPERLU_FREE(work);
    return 0;
}